

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

LoopStatement * __thiscall
soul::PoolAllocator::allocate<soul::AST::LoopStatement,soul::AST::Context>
          (PoolAllocator *this,Context *args)

{
  SourceCodeText *pSVar1;
  PoolItem *pPVar2;
  
  pPVar2 = allocateSpaceForObject(this,0x50);
  pPVar2->item = &PTR__ASTObject_002d4778;
  *(undefined4 *)&pPVar2->field_0x18 = 0xd;
  pSVar1 = (args->location).sourceCode.object;
  pPVar2[1].size = (size_t)pSVar1;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  pPVar2[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar2[1].item = args->parentScope;
  pPVar2->item = &PTR__LoopStatement_002d61c0;
  *(undefined8 *)&pPVar2[1].field_0x18 = 0;
  pPVar2[2].size = 0;
  pPVar2[2].destructor = (DestructorFn *)0x0;
  pPVar2[2].item = (void *)0x0;
  *(undefined8 *)&pPVar2[2].field_0x18 = 0;
  pPVar2->destructor =
       allocate<soul::AST::LoopStatement,_soul::AST::Context>::anon_class_1_0_00000001::__invoke;
  return (LoopStatement *)&pPVar2->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }